

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O3

uint64_t call_recip_estimate(int *exp,int exp_off,uint64_t frac)

{
  uint uVar1;
  ulong uVar2;
  uint64_t uVar3;
  int iVar4;
  
  if (*exp == 0) {
    if ((frac >> 0x33 & 1) == 0) {
      *exp = -1;
      frac = frac << 2;
    }
    else {
      frac = frac * 2;
    }
  }
  uVar1 = recip_estimate((uint)(frac >> 0x2c) & 0xff | 0x100);
  iVar4 = exp_off - *exp;
  uVar2 = (ulong)(uVar1 & 0xff);
  if (iVar4 == -1) {
    uVar3 = (uVar2 | 0x100) << 0x2a;
  }
  else {
    if (iVar4 != 0) {
      uVar3 = uVar2 << 0x2c;
      goto LAB_0068c21d;
    }
    uVar3 = (uVar2 | 0x100) << 0x2b;
  }
  iVar4 = 0;
LAB_0068c21d:
  *exp = iVar4;
  return uVar3;
}

Assistant:

static uint64_t call_recip_estimate(int *exp, int exp_off, uint64_t frac)
{
    uint32_t scaled, estimate;
    uint64_t result_frac;
    int result_exp;

    /* Handle sub-normals */
    if (*exp == 0) {
        if (extract64(frac, 51, 1) == 0) {
            *exp = -1;
            frac <<= 2;
        } else {
            frac <<= 1;
        }
    }

    /* scaled = UInt('1':fraction<51:44>) */
    scaled = deposit32(1 << 8, 0, 8, extract64(frac, 44, 8));
    estimate = recip_estimate(scaled);

    result_exp = exp_off - *exp;
    result_frac = deposit64(0, 44, 8, estimate);
    if (result_exp == 0) {
        result_frac = deposit64(result_frac >> 1, 51, 1, 1);
    } else if (result_exp == -1) {
        result_frac = deposit64(result_frac >> 2, 50, 2, 1);
        result_exp = 0;
    }

    *exp = result_exp;

    return result_frac;
}